

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseCDSect(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  _xmlSAXHandler *p_Var3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  cdataBlockSAXFunc p_Var10;
  int iVar11;
  char *msg;
  ulong uVar12;
  int iVar13;
  int l;
  int sl;
  int rl;
  int local_54;
  ulong local_50;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  ulong uVar7;
  
  pxVar2 = ctxt->input;
  pxVar8 = pxVar2->cur;
  if (ctxt->mlType == XML_TYPE_XML) {
    if (*pxVar8 != '<') {
      return;
    }
    if (pxVar8[1] != '!') {
      return;
    }
    if (pxVar8[2] != '[') {
      return;
    }
    if (pxVar8[3] != 'C') {
      return;
    }
    if (pxVar8[4] != 'D') {
      return;
    }
    if (pxVar8[5] != 'A') {
      return;
    }
    if (pxVar8[6] != 'T') {
      return;
    }
    if (pxVar8[7] != 'A') {
      return;
    }
    if (pxVar8[8] != '[') {
      return;
    }
    pxVar2->cur = pxVar8 + 9;
    pxVar2->col = pxVar2->col + 9;
    xVar1 = pxVar8[9];
  }
  else {
    if (*pxVar8 != '<') {
      return;
    }
    if (pxVar8[1] != '[') {
      return;
    }
    if (pxVar8[2] != '[') {
      return;
    }
    pxVar2->cur = pxVar8 + 3;
    pxVar2->col = pxVar2->col + 3;
    xVar1 = pxVar8[3];
  }
  if (xVar1 == '\0') {
    xmlParserInputGrow(pxVar2,0xfa);
  }
  ctxt->instate = XML_PARSER_CDATA_SECTION;
  uVar4 = xmlCurrentChar(ctxt,&local_3c);
  if ((int)uVar4 < 0x100) {
    if (((int)uVar4 < 0x20) && ((0xd < uVar4 || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0))))
    goto LAB_00165c68;
  }
  else if (0xfffff < uVar4 - 0x10000 && (0x1ffd < uVar4 - 0xe000 && 0xd7ff < uVar4))
  goto LAB_00165c68;
  pxVar2 = ctxt->input;
  if (*pxVar2->cur == '\n') {
    pxVar2->line = pxVar2->line + 1;
    pxVar2->col = 1;
  }
  else {
    pxVar2->col = pxVar2->col + 1;
  }
  pxVar2->cur = pxVar2->cur + local_3c;
  uVar5 = xmlCurrentChar(ctxt,&local_40);
  uVar7 = CONCAT44(extraout_var,uVar5);
  if ((int)uVar5 < 0x100) {
    if ((0x1f < (int)uVar5) || ((uVar5 < 0xe && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0)))) {
LAB_00165c1a:
      pxVar2 = ctxt->input;
      if (*pxVar2->cur == '\n') {
        pxVar2->line = pxVar2->line + 1;
        pxVar2->col = 1;
      }
      else {
        pxVar2->col = pxVar2->col + 1;
      }
      pxVar2->cur = pxVar2->cur + local_40;
      uVar5 = xmlCurrentChar(ctxt,&local_54);
      pxVar8 = (xmlChar *)(*xmlMallocAtomic)(100);
      if (pxVar8 == (xmlChar *)0x0) {
LAB_00165eb2:
        xmlErrMemory(ctxt,(char *)0x0);
        return;
      }
      iVar13 = 100;
      local_50 = 0;
      local_44 = 0;
      uVar12 = (ulong)uVar4;
      do {
        pxVar9 = pxVar8;
        local_38 = uVar7;
        if (0xff < (int)uVar5) {
          if (uVar5 - 0x10000 < 0x100000 || (uVar5 - 0xe000 < 0x1ffe || uVar5 < 0xd800))
          goto LAB_00165d5c;
LAB_00165e7e:
          pxVar8[(int)local_50] = '\0';
          ctxt->instate = XML_PARSER_CONTENT;
          msg = "CData section not finished\n%.50s\n";
LAB_00165f08:
          xmlFatalErrMsgStr(ctxt,XML_ERR_CDATA_NOT_FINISHED,msg,pxVar8);
          goto LAB_00165f17;
        }
        if ((int)uVar5 < 0x20) {
          if ((0xd < uVar5) || ((0x2600U >> (uVar5 & 0x1f) & 1) == 0)) goto LAB_00165e7e;
        }
        else if (uVar5 == 0x3e && ((int)uVar7 == 0x5d && (int)uVar12 == 0x5d)) {
          pxVar8[(int)local_50] = '\0';
          ctxt->instate = XML_PARSER_CONTENT;
          pxVar2 = ctxt->input;
          if (*pxVar2->cur == '\n') {
            pxVar2->line = pxVar2->line + 1;
            pxVar2->col = 1;
          }
          else {
            pxVar2->col = pxVar2->col + 1;
          }
          pxVar2->cur = pxVar2->cur + local_54;
          p_Var3 = ctxt->sax;
          if (((p_Var3 != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
             ((p_Var10 = p_Var3->cdataBlock, p_Var10 != (cdataBlockSAXFunc)0x0 ||
              (p_Var10 = p_Var3->characters, p_Var10 != (cdataBlockSAXFunc)0x0)))) {
            (*p_Var10)(ctxt->userData,pxVar8,(int)local_50);
          }
LAB_00165f17:
          (*xmlFree)(pxVar9);
          return;
        }
LAB_00165d5c:
        if (iVar13 <= (int)local_50 + 5) {
          if ((10000000 < iVar13) && ((ctxt->options & 0x80000) == 0)) {
            msg = "CData section too big found";
            pxVar8 = (xmlChar *)0x0;
            goto LAB_00165f08;
          }
          iVar13 = iVar13 * 2;
          pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar8,(long)iVar13);
          if (pxVar9 == (xmlChar *)0x0) {
            (*xmlFree)(pxVar8);
            goto LAB_00165eb2;
          }
        }
        iVar11 = (int)local_50;
        if (local_3c == 1) {
          uVar4 = iVar11 + 1;
          pxVar9[iVar11] = (xmlChar)uVar12;
        }
        else {
          iVar6 = xmlCopyCharMultiByte(pxVar9 + iVar11,(int)uVar12);
          uVar4 = iVar6 + iVar11;
        }
        local_50 = (ulong)uVar4;
        local_3c = local_40;
        local_40 = local_54;
        if (local_44 < 0x32) {
          iVar11 = local_44 + 1;
        }
        else {
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          iVar11 = 0;
          if (ctxt->instate == XML_PARSER_EOF) goto LAB_00165f17;
        }
        pxVar2 = ctxt->input;
        if (*pxVar2->cur == '\n') {
          pxVar2->line = pxVar2->line + 1;
          pxVar2->col = 1;
        }
        else {
          pxVar2->col = pxVar2->col + 1;
        }
        pxVar2->cur = pxVar2->cur + local_54;
        local_44 = iVar11;
        uVar4 = xmlCurrentChar(ctxt,&local_54);
        uVar7 = (ulong)uVar5;
        uVar12 = local_38;
        pxVar8 = pxVar9;
        uVar5 = uVar4;
      } while( true );
    }
  }
  else if (uVar5 - 0x10000 < 0x100000 || (uVar5 - 0xe000 < 0x1ffe || uVar5 < 0xd800))
  goto LAB_00165c1a;
LAB_00165c68:
  xmlFatalErr(ctxt,XML_ERR_CDATA_NOT_FINISHED,(char *)0x0);
  ctxt->instate = XML_PARSER_CONTENT;
  return;
}

Assistant:

void
xmlParseCDSect(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int r, rl;
    int	s, sl;
    int cur, l;
    int count = 0;

    DEBUG_ENTER(("xmlParseCDSect(%s);\n", dbgCtxt(ctxt)));

    /* Check 2.6.0 was NXT(0) not RAW */
    if (ISXML) {						/* XML*/
      if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
	  SKIP(9);
      } else
	  RETURN();
    } else {							/* SML */
      if (CMP3(CUR_PTR, '<', '[', '[')) {
	  SKIP(3);
      } else
	  RETURN();
    }

    ctxt->instate = XML_PARSER_CDATA_SECTION;
    r = CUR_CHAR(rl);
    if (!IS_CHAR(r)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
	ctxt->instate = XML_PARSER_CONTENT;
        RETURN();
    }
    NEXTL(rl);
    s = CUR_CHAR(sl);
    if (!IS_CHAR(s)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
	ctxt->instate = XML_PARSER_CONTENT;
        RETURN();
    }
    NEXTL(sl);
    cur = CUR_CHAR(l);
    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	RETURN();
    }
    while (IS_CHAR(cur) &&
           ((r != ']') || (s != ']') || (cur != '>'))) {
	if (len + 5 >= size) {
	    xmlChar *tmp;

            if ((size > XML_MAX_TEXT_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_CDATA_NOT_FINISHED,
                             "CData section too big found", NULL);
                xmlFree (buf);
                RETURN();
            }
	    tmp = (xmlChar *) xmlRealloc(buf, size * 2 * sizeof(xmlChar));
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		RETURN();
	    }
	    buf = tmp;
	    size *= 2;
	}
	COPY_BUF(rl,buf,len,r);
	r = s;
	rl = sl;
	s = cur;
	sl = l;
	count++;
	if (count > 50) {
	    GROW;
            if (ctxt->instate == XML_PARSER_EOF) {
		xmlFree(buf);
		RETURN();
            }
	    count = 0;
	}
	NEXTL(l);
	cur = CUR_CHAR(l);
    }
    buf[len] = 0;
    ctxt->instate = XML_PARSER_CONTENT;
    if (cur != '>') {
	xmlFatalErrMsgStr(ctxt, XML_ERR_CDATA_NOT_FINISHED,
	                     "CData section not finished\n%.50s\n", buf);
	xmlFree(buf);
        RETURN();
    }
    NEXTL(l);

    /*
     * OK the buffer is to be consumed as cdata.
     */
    if ((ctxt->sax != NULL) && (!ctxt->disableSAX)) {
	if (ctxt->sax->cdataBlock != NULL)
	    ctxt->sax->cdataBlock(ctxt->userData, buf, len);
	else if (ctxt->sax->characters != NULL)
	    ctxt->sax->characters(ctxt->userData, buf, len);
    }
    xmlFree(buf);
    RETURN_COMMENT(("xmlParseCDSect. ctxt = %s;\n", dbgCtxt(ctxt)));
}